

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

CURLcode Curl_cshutdn_add_pollfds(cshutdn *cshutdn,Curl_easy *data,curl_pollfds *cpfds)

{
  CURLcode CVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn_00;
  connectdata *conn;
  easy_pollset ps;
  Curl_llist_node *e;
  CURLcode result;
  curl_pollfds *cpfds_local;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  pCVar2 = Curl_llist_head(&cshutdn->list);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (ps._24_8_ = Curl_llist_head(&cshutdn->list); ps._24_8_ != 0;
        ps._24_8_ = Curl_node_next((Curl_llist_node *)ps._24_8_)) {
      conn_00 = (connectdata *)Curl_node_elem((Curl_llist_node *)ps._24_8_);
      memset(&conn,0,0x20);
      Curl_attach_connection(data,conn_00);
      Curl_conn_adjust_pollset(data,conn_00,(easy_pollset *)&conn);
      Curl_detach_connection(data);
      CVar1 = Curl_pollfds_add_ps(cpfds,(easy_pollset *)&conn);
      if (CVar1 != CURLE_OK) {
        Curl_pollfds_cleanup(cpfds);
        return CVar1;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cshutdn_add_pollfds(struct cshutdn *cshutdn,
                                  struct Curl_easy *data,
                                  struct curl_pollfds *cpfds)
{
  CURLcode result = CURLE_OK;

  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      result = Curl_pollfds_add_ps(cpfds, &ps);
      if(result) {
        Curl_pollfds_cleanup(cpfds);
        goto out;
      }
    }
  }
out:
  return result;
}